

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalWatcomWMakeGenerator.cxx
# Opt level: O2

void cmGlobalWatcomWMakeGenerator::GetDocumentation(cmDocumentationEntry *entry)

{
  string local_30 [32];
  
  GetActualName_abi_cxx11_();
  std::__cxx11::string::operator=((string *)entry,local_30);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::assign((char *)&entry->Brief);
  return;
}

Assistant:

void cmGlobalWatcomWMakeGenerator
::GetDocumentation(cmDocumentationEntry& entry)
{
  entry.Name = cmGlobalWatcomWMakeGenerator::GetActualName();
  entry.Brief = "Generates Watcom WMake makefiles.";
}